

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

zarray_t * apriltag_detector_detect(apriltag_detector_t *td,image_u8_t *im_orig)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  uint height;
  timeprofile_t *ptVar13;
  matd_t *pmVar14;
  apriltag_family_t *__size;
  char *__base;
  undefined8 uVar15;
  size_t sVar16;
  size_t sVar17;
  float *pfVar18;
  double *pdVar19;
  apriltag_detection_t *det;
  int y;
  int iVar20;
  int iVar21;
  uint32_t uVar22;
  int iVar23;
  workerpool_t *pwVar24;
  int64_t iVar25;
  image_u8_t *piVar26;
  zarray_t *pzVar27;
  image_u8_t *piVar28;
  long lVar29;
  ulong uVar30;
  zarray_t *pzVar31;
  zarray_t *za;
  FILE *pFVar32;
  image_u8x3_t *im;
  apriltag_detector_t *paVar33;
  int i_1;
  long lVar34;
  apriltag_detection_t *outp;
  int i;
  apriltag_detection_t *det_00;
  int i_5;
  apriltag_detection_t *za_00;
  int i_2;
  int i_7;
  uint uVar35;
  int *p;
  float fVar36;
  double dVar37;
  float fVar38;
  float fVar39;
  int aiStack_88 [2];
  ulong local_80;
  zarray_t *local_78;
  apriltag_detection_t *local_70;
  zarray_t *local_68;
  apriltag_detection_t *local_60;
  apriltag_detection_t *det1;
  image_u8_t *local_50;
  float local_48 [2];
  quad *q;
  apriltag_detector_t *local_38;
  
  local_50 = im_orig;
  iVar20 = zarray_size(td->tag_families);
  if (iVar20 == 0) {
    pzVar27 = zarray_create(8);
    printf("apriltag.c: No tag families enabled.");
    return pzVar27;
  }
  local_38 = td;
  if (td->wp == (workerpool_t *)0x0) {
    pwVar24 = (workerpool_t *)0x0;
  }
  else {
    iVar20 = td->nthreads;
    iVar21 = workerpool_get_nthreads(td->wp);
    paVar33 = local_38;
    if (iVar20 == iVar21) goto LAB_00109b5f;
    pwVar24 = local_38->wp;
  }
  paVar33 = local_38;
  workerpool_destroy(pwVar24);
  pwVar24 = workerpool_create(paVar33->nthreads);
  paVar33->wp = pwVar24;
LAB_00109b5f:
  ptVar13 = paVar33->tp;
  zarray_clear(ptVar13->stamps);
  iVar25 = utime_now();
  ptVar13->utime = iVar25;
  timeprofile_stamp(local_38->tp,"init");
  piVar26 = local_50;
  if (1.0 < local_38->quad_decimate) {
    piVar26 = image_u8_decimate(local_50,local_38->quad_decimate);
    timeprofile_stamp(local_38->tp,"decimate");
  }
  fVar36 = local_38->quad_sigma;
  if ((fVar36 != 0.0) || (NAN(fVar36))) {
    uVar35 = (int)(ABS(fVar36) * 4.0) | 1;
    if (1 < (int)uVar35) {
      dVar37 = (double)ABS(fVar36);
      if (fVar36 <= 0.0) {
        local_78 = (zarray_t *)dVar37;
        piVar28 = image_u8_copy(piVar26);
        image_u8_gaussian_blur(piVar26,(double)local_78,uVar35);
        for (iVar20 = 0; iVar20 < piVar28->height; iVar20 = iVar20 + 1) {
          for (lVar29 = 0; (int)lVar29 < piVar28->width; lVar29 = lVar29 + 1) {
            lVar34 = (long)piVar26->stride * (long)iVar20;
            iVar21 = (uint)piVar28->buf[lVar29 + (long)piVar28->stride * (long)iVar20] * 2 -
                     (uint)piVar26->buf[lVar29 + lVar34];
            if (iVar21 < 1) {
              iVar21 = 0;
            }
            if (0xfe < iVar21) {
              iVar21 = 0xff;
            }
            piVar26->buf[lVar29 + lVar34] = (uint8_t)iVar21;
          }
        }
        image_u8_destroy(piVar28);
      }
      else {
        image_u8_gaussian_blur(piVar26,dVar37,uVar35);
      }
    }
  }
  timeprofile_stamp(local_38->tp,"blur/sharp");
  if (local_38->debug != 0) {
    image_u8_write_pnm(piVar26,"debug_preprocess.pnm");
  }
  paVar33 = local_38;
  pzVar27 = apriltag_quad_thresh(local_38,piVar26);
  local_68 = pzVar27;
  if (1.0 < paVar33->quad_decimate) {
    for (iVar20 = 0; iVar21 = zarray_size(pzVar27), iVar20 < iVar21; iVar20 = iVar20 + 1) {
      zarray_get_volatile(pzVar27,iVar20,local_48);
      lVar29 = CONCAT44(local_48[1],local_48[0]);
      for (lVar34 = 0; lVar34 != 4; lVar34 = lVar34 + 1) {
        fVar36 = local_38->quad_decimate;
        if ((fVar36 != 1.5) || (NAN(fVar36))) {
          *(float *)(lVar29 + lVar34 * 8) = (*(float *)(lVar29 + lVar34 * 8) + -0.5) * fVar36 + 0.5;
          fVar36 = local_38->quad_decimate * (*(float *)(lVar29 + 4 + lVar34 * 8) + -0.5) + 0.5;
        }
        else {
          *(float *)(lVar29 + lVar34 * 8) = *(float *)(lVar29 + lVar34 * 8) * 1.5;
          fVar36 = local_38->quad_decimate * *(float *)(lVar29 + 4 + lVar34 * 8);
        }
        *(float *)(lVar29 + 4 + lVar34 * 8) = fVar36;
      }
    }
  }
  if (piVar26 != local_50) {
    image_u8_destroy(piVar26);
  }
  local_70 = (apriltag_detection_t *)zarray_create(8);
  pzVar27 = local_68;
  uVar22 = zarray_size(local_68);
  paVar33 = local_38;
  local_38->nquads = uVar22;
  timeprofile_stamp(local_38->tp,"quads");
  piVar26 = (image_u8_t *)0x0;
  if (paVar33->debug != 0) {
    piVar28 = image_u8_copy(local_50);
    image_u8_darken(piVar28);
    image_u8_darken(piVar28);
    srandom(0);
    while( true ) {
      iVar20 = zarray_size(pzVar27);
      iVar21 = (int)piVar26;
      if (iVar20 <= iVar21) break;
      zarray_get_volatile(pzVar27,iVar21,local_48);
      lVar29 = random();
      iVar20 = (int)(lVar29 % 0x9b) + 100;
      pfVar18 = (float *)CONCAT44(local_48[1],local_48[0]);
      image_u8_draw_line(piVar28,*pfVar18,pfVar18[1],pfVar18[2],pfVar18[3],iVar20,1);
      lVar29 = CONCAT44(local_48[1],local_48[0]);
      image_u8_draw_line(piVar28,*(float *)(lVar29 + 8),*(float *)(lVar29 + 0xc),
                         *(float *)(lVar29 + 0x10),*(float *)(lVar29 + 0x14),iVar20,1);
      lVar29 = CONCAT44(local_48[1],local_48[0]);
      image_u8_draw_line(piVar28,*(float *)(lVar29 + 0x10),*(float *)(lVar29 + 0x14),
                         *(float *)(lVar29 + 0x18),*(float *)(lVar29 + 0x1c),iVar20,1);
      pzVar27 = local_68;
      pfVar18 = (float *)CONCAT44(local_48[1],local_48[0]);
      image_u8_draw_line(piVar28,pfVar18[6],pfVar18[7],*pfVar18,pfVar18[1],iVar20,1);
      piVar26 = (image_u8_t *)(ulong)(iVar21 + 1);
    }
    image_u8_write_pnm(piVar28,"debug_quads_raw.pnm");
    image_u8_destroy(piVar28);
    if (local_38->debug == 0) {
      piVar26 = (image_u8_t *)0x0;
    }
    else {
      piVar26 = image_u8_copy(local_50);
    }
  }
  iVar20 = zarray_size(pzVar27);
  uVar35 = local_38->nthreads * 10;
  outp = (apriltag_detection_t *)(ulong)uVar35;
  iVar21 = iVar20 / (int)uVar35 + 1;
  iVar20 = zarray_size(pzVar27);
  uVar30 = (ulong)(iVar20 / iVar21 + 1);
  p = aiStack_88 + uVar30 * -0xc;
  iVar20 = 0;
  local_78 = (zarray_t *)aiStack_88;
  while( true ) {
    (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109f65;
    (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
    iVar23 = zarray_size(pzVar27);
    if (iVar23 <= iVar20) break;
    *p = iVar20;
    (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109f75;
    (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
    iVar23 = zarray_size(pzVar27);
    iVar20 = iVar20 + iVar21;
    if (iVar20 <= iVar23) {
      iVar23 = iVar20;
    }
    p[1] = iVar23;
    *(zarray_t **)(p + 2) = pzVar27;
    paVar33 = local_38;
    *(apriltag_detector_t **)(p + 4) = local_38;
    *(image_u8_t **)(p + 6) = local_50;
    outp = local_70;
    *(apriltag_detection_t **)(p + 8) = local_70;
    *(image_u8_t **)(p + 10) = piVar26;
    pwVar24 = paVar33->wp;
    (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109fb6;
    (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
    workerpool_add_task(pwVar24,quad_decode_task,p);
    p = p + 0xc;
  }
  pwVar24 = local_38->wp;
  (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109fc9;
  (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
  workerpool_run(pwVar24);
  if (piVar26 != (image_u8_t *)0x0) {
    (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109fdd;
    (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
    image_u8_write_pnm(piVar26,"debug_samples.pnm");
    (aiStack_88 + uVar30 * -0xc + -2)[0] = 0x109fe5;
    (aiStack_88 + uVar30 * -0xc + -2)[1] = 0;
    image_u8_destroy(piVar26);
  }
  piVar26 = local_50;
  pzVar31 = local_68;
  pzVar27 = local_78;
  if (local_38->debug != 0) {
    *(undefined8 *)((long)local_78 + -8) = 0x10a004;
    piVar26 = image_u8_copy(piVar26);
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a00f;
    image_u8_darken(piVar26);
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a017;
    image_u8_darken(piVar26);
    iVar20 = 0;
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a021;
    srandom(0);
    *(undefined8 *)((long)pzVar27 + -8) = 1;
    uVar15 = *(undefined8 *)((long)pzVar27 + -8);
    while( true ) {
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a033;
      iVar21 = zarray_size(pzVar31);
      if (iVar21 <= iVar20) break;
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a04b;
      zarray_get_volatile(pzVar31,iVar20,local_48);
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a050;
      lVar29 = random();
      iVar23 = (int)(lVar29 % 0x9b) + 100;
      pfVar18 = (float *)CONCAT44(local_48[1],local_48[0]);
      fVar36 = *pfVar18;
      fVar38 = pfVar18[1];
      fVar39 = pfVar18[2];
      fVar1 = pfVar18[3];
      iVar21 = (int)uVar15;
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a07e;
      image_u8_draw_line(piVar26,fVar36,fVar38,fVar39,fVar1,iVar23,iVar21);
      lVar29 = CONCAT44(local_48[1],local_48[0]);
      fVar36 = *(float *)(lVar29 + 8);
      fVar38 = *(float *)(lVar29 + 0xc);
      fVar39 = *(float *)(lVar29 + 0x10);
      fVar1 = *(float *)(lVar29 + 0x14);
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a0a4;
      image_u8_draw_line(piVar26,fVar36,fVar38,fVar39,fVar1,iVar23,iVar21);
      lVar29 = CONCAT44(local_48[1],local_48[0]);
      fVar36 = *(float *)(lVar29 + 0x10);
      fVar38 = *(float *)(lVar29 + 0x14);
      fVar39 = *(float *)(lVar29 + 0x18);
      fVar1 = *(float *)(lVar29 + 0x1c);
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a0ca;
      image_u8_draw_line(piVar26,fVar36,fVar38,fVar39,fVar1,iVar23,iVar21);
      pzVar31 = local_68;
      pfVar18 = (float *)CONCAT44(local_48[1],local_48[0]);
      fVar36 = pfVar18[6];
      fVar38 = pfVar18[7];
      fVar39 = *pfVar18;
      fVar1 = pfVar18[1];
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a0f3;
      image_u8_draw_line(piVar26,fVar36,fVar38,fVar39,fVar1,iVar23,iVar21);
      iVar20 = iVar20 + 1;
    }
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a10a;
    image_u8_write_pnm(piVar26,"debug_quads_fixed.pnm");
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a112;
    image_u8_destroy(piVar26);
  }
  ptVar13 = local_38->tp;
  *(undefined8 *)((long)pzVar27 + -8) = 0x10a126;
  timeprofile_stamp(ptVar13,"decode+refinement");
  *(undefined8 *)((long)pzVar27 + -8) = 4;
  uVar15 = *(undefined8 *)((long)pzVar27 + -8);
  *(undefined8 *)((long)pzVar27 + -8) = 0x10a130;
  pzVar31 = g2d_polygon_create_zeros((int)uVar15);
  *(undefined8 *)((long)pzVar27 + -8) = 0x10a13a;
  za = g2d_polygon_create_zeros((int)uVar15);
  iVar20 = 0;
  za_00 = local_70;
  local_78 = pzVar31;
LAB_0010a147:
  do {
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a14f;
    iVar21 = zarray_size((zarray_t *)za_00);
    if (iVar21 <= iVar20) {
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a308;
      zarray_destroy(pzVar31);
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a310;
      zarray_destroy(za);
      paVar33 = local_38;
      ptVar13 = local_38->tp;
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a324;
      timeprofile_stamp(ptVar13,"reconcile");
      piVar26 = local_50;
      if (paVar33->debug != 0) {
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a33a;
        piVar26 = image_u8_copy(piVar26);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a345;
        image_u8_darken(piVar26);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a34d;
        image_u8_darken(piVar26);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a360;
        pFVar32 = fopen("debug_output.ps","w");
        iVar23 = 0;
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a376;
        fprintf(pFVar32,"%%!PS\n\n");
        iVar20 = piVar26->width;
        iVar21 = piVar26->height;
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a39e;
        dVar37 = fmin(612.0 / (double)iVar20,792.0 / (double)iVar21);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a3b3;
        fprintf(pFVar32,"%f %f scale\n",dVar37,dVar37);
        uVar35 = piVar26->height;
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a3c8;
        fprintf(pFVar32,"0 %d translate\n",(ulong)uVar35);
        *(undefined8 *)((long)pzVar27 + -8) = 0xb;
        sVar16 = *(size_t *)((long)pzVar27 + -8);
        *(undefined8 *)((long)pzVar27 + -8) = 1;
        sVar17 = *(size_t *)((long)pzVar27 + -8);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a3dd;
        fwrite("1 -1 scale\n",sVar16,sVar17,pFVar32);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a3e8;
        postscript_image((FILE *)pFVar32,piVar26);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a3f0;
        image_u8_destroy(piVar26);
        while( true ) {
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a405;
          iVar20 = zarray_size((zarray_t *)za_00);
          if (iVar20 <= iVar23) break;
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a41b;
          zarray_get((zarray_t *)za_00,iVar23,&local_60);
          for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a429;
            lVar34 = random();
            local_48[lVar29] = (float)(lVar34 % 0x9b + 100);
          }
          fVar36 = local_48[0] / 255.0;
          fVar38 = local_48[1] / 255.0;
          fVar39 = q._0_4_ / 255.0;
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a483;
          fprintf(pFVar32,"%f %f %f setrgbcolor\n",(double)fVar36,(double)fVar38,(double)fVar39);
          dVar37 = local_60->p[0][0];
          dVar5 = local_60->p[0][1];
          dVar6 = local_60->p[1][0];
          dVar7 = local_60->p[1][1];
          dVar8 = local_60->p[2][0];
          dVar9 = local_60->p[2][1];
          dVar10 = local_60->p[3][0];
          dVar11 = local_60->p[3][1];
          *(double *)((long)pzVar27 + -8) = dVar5;
          *(double *)((long)pzVar27 + -0x10) = dVar37;
          *(undefined8 *)((long)pzVar27 + -0x18) = 0x10a4cb;
          fprintf(pFVar32,
                  "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",dVar37
                  ,dVar5,dVar6,dVar7,dVar8,dVar9,dVar10,dVar11);
          iVar23 = iVar23 + 1;
          za_00 = local_70;
        }
        *(undefined8 *)((long)pzVar27 + -8) = 9;
        sVar16 = *(size_t *)((long)pzVar27 + -8);
        *(undefined8 *)((long)pzVar27 + -8) = 1;
        sVar17 = *(size_t *)((long)pzVar27 + -8);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a4ed;
        fwrite("showpage\n",sVar16,sVar17,pFVar32);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a4f5;
        fclose(pFVar32);
        piVar26 = local_50;
        paVar33 = local_38;
        if (local_38->debug != 0) {
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a50f;
          piVar28 = image_u8_copy(piVar26);
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a51a;
          image_u8_darken(piVar28);
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a522;
          image_u8_darken(piVar28);
          uVar35 = piVar28->width;
          height = piVar28->height;
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a52c;
          im = image_u8x3_create(uVar35,height);
          for (iVar20 = 0; iVar20 < piVar26->height; iVar20 = iVar20 + 1) {
            iVar21 = 0;
            lVar29 = (long)iVar20;
            for (lVar34 = 0; (int)lVar34 < piVar26->width; lVar34 = lVar34 + 1) {
              im->buf[im->stride * iVar20 + iVar21] =
                   piVar28->buf[lVar34 + piVar28->stride * lVar29];
              im->buf[(long)(im->stride * iVar20 + iVar21) + 1] =
                   piVar28->buf[lVar34 + piVar28->stride * lVar29];
              im->buf[(long)(im->stride * iVar20 + iVar21) + 2] =
                   piVar28->buf[lVar34 + piVar28->stride * lVar29];
              iVar21 = iVar21 + 3;
            }
          }
          uVar30 = 0;
          while( true ) {
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a5dd;
            iVar20 = zarray_size((zarray_t *)za_00);
            if (iVar20 <= (int)uVar30) break;
            local_80 = uVar30;
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a5f7;
            zarray_get((zarray_t *)za_00,(int)uVar30,&local_60);
            for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
              *(undefined8 *)((long)pzVar27 + -8) = 0x10a604;
              lVar34 = random();
              local_48[lVar29] = (float)(lVar34 % 0x9b + 100);
            }
            local_78 = (zarray_t *)CONCAT44(local_78._4_4_,(int)local_48[0]);
            iVar21 = (int)local_48[1];
            iVar20 = (int)q._0_4_;
            *(undefined8 *)((long)pzVar27 + -8) = 0x38;
            lVar29 = *(long *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 1;
            for (lVar34 = *(long *)((long)pzVar27 + -8); lVar34 != 5; lVar34 = lVar34 + 1) {
              dVar37 = *(double *)((long)local_60->c + lVar29 + -0x28);
              dVar5 = *(double *)((long)local_60->c + lVar29 + -0x20);
              uVar30 = (ulong)(((uint)lVar34 & 3) << 4);
              dVar6 = *(double *)((long)local_60->p[0] + uVar30);
              dVar7 = *(double *)((long)local_60->p[0] + uVar30 + 8);
              det1._5_1_ = SUB81(local_78,0);
              det1._6_1_ = (undefined1)iVar21;
              det1._7_1_ = (undefined1)iVar20;
              *(undefined8 *)((long)pzVar27 + -8) = 1;
              uVar15 = *(undefined8 *)((long)pzVar27 + -8);
              *(undefined8 *)((long)pzVar27 + -8) = 0x10a680;
              image_u8x3_draw_line
                        (im,(float)dVar37,(float)dVar5,(float)dVar6,(float)dVar7,
                         (uint8_t *)((long)&det1 + 5),(int)uVar15);
              lVar29 = lVar29 + 0x10;
            }
            uVar30 = (ulong)((int)local_80 + 1);
            za_00 = local_70;
          }
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a6a7;
          image_u8x3_write_pnm(im,"debug_output.pnm");
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a6af;
          image_u8x3_destroy(im);
          paVar33 = local_38;
          if (local_38->debug != 0) {
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a6d0;
            pFVar32 = fopen("debug_quads.ps","w");
            iVar23 = 0;
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a6e7;
            fprintf(pFVar32,"%%!PS\n\n");
            piVar26 = local_50;
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a6f0;
            piVar26 = image_u8_copy(piVar26);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a6fb;
            image_u8_darken(piVar26);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a703;
            image_u8_darken(piVar26);
            iVar20 = piVar26->width;
            iVar21 = piVar26->height;
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a729;
            dVar37 = fmin(612.0 / (double)iVar20,792.0 / (double)iVar21);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a73e;
            fprintf(pFVar32,"%f %f scale\n",dVar37,dVar37);
            uVar35 = piVar26->height;
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a752;
            fprintf(pFVar32,"0 %d translate\n",(ulong)uVar35);
            *(undefined8 *)((long)pzVar27 + -8) = 0xb;
            sVar16 = *(size_t *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 1;
            sVar17 = *(size_t *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a767;
            fwrite("1 -1 scale\n",sVar16,sVar17,pFVar32);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a772;
            postscript_image((FILE *)pFVar32,piVar26);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a77a;
            image_u8_destroy(piVar26);
            while( true ) {
              pzVar31 = local_68;
              *(undefined8 *)((long)pzVar27 + -8) = 0x10a793;
              iVar20 = zarray_size(pzVar31);
              if (iVar20 <= iVar23) break;
              *(undefined8 *)((long)pzVar27 + -8) = 0x10a7ab;
              zarray_get_volatile(pzVar31,iVar23,&local_60);
              for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
                *(undefined8 *)((long)pzVar27 + -8) = 0x10a7b9;
                lVar34 = random();
                local_48[lVar29] = (float)(lVar34 % 0x9b + 100);
              }
              fVar36 = local_48[0] / 255.0;
              fVar38 = local_48[1] / 255.0;
              fVar39 = q._0_4_ / 255.0;
              *(undefined8 *)((long)pzVar27 + -8) = 0x10a813;
              fprintf(pFVar32,"%f %f %f setrgbcolor\n",(double)fVar36,(double)fVar38,(double)fVar39)
              ;
              fVar36 = *(float *)&local_60->family;
              dVar37 = (double)*(float *)((long)&local_60->family + 4);
              fVar38 = (float)local_60->id;
              fVar39 = (float)local_60->hamming;
              fVar1 = local_60->decision_margin;
              fVar2 = *(float *)&local_60->field_0x14;
              fVar3 = *(float *)&local_60->H;
              fVar4 = *(float *)((long)&local_60->H + 4);
              *(double *)((long)pzVar27 + -8) = dVar37;
              *(double *)((long)pzVar27 + -0x10) = (double)fVar36;
              *(undefined8 *)((long)pzVar27 + -0x18) = 0x10a85a;
              fprintf(pFVar32,
                      "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                      (double)fVar36,dVar37,(double)fVar38,(double)fVar39,(double)fVar1,
                      (double)fVar2,(double)fVar3,(double)fVar4);
              iVar23 = iVar23 + 1;
            }
            *(undefined8 *)((long)pzVar27 + -8) = 9;
            sVar16 = *(size_t *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 1;
            sVar17 = *(size_t *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a879;
            fwrite("showpage\n",sVar16,sVar17,pFVar32);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a881;
            fclose(pFVar32);
            paVar33 = local_38;
            za_00 = local_70;
          }
        }
      }
      ptVar13 = paVar33->tp;
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a899;
      timeprofile_stamp(ptVar13,"debug output");
      pzVar31 = local_68;
      iVar20 = 0;
      while( true ) {
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a8ab;
        iVar21 = zarray_size(pzVar31);
        if (iVar21 <= iVar20) break;
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a8bc;
        zarray_get_volatile(pzVar31,iVar20,local_48);
        pmVar14 = *(matd_t **)(CONCAT44(local_48[1],local_48[0]) + 0x28);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a8c9;
        matd_destroy(pmVar14);
        pmVar14 = *(matd_t **)(CONCAT44(local_48[1],local_48[0]) + 0x30);
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a8d6;
        matd_destroy(pmVar14);
        iVar20 = iVar20 + 1;
      }
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a8e2;
      zarray_destroy(pzVar31);
      if (za_00 != (apriltag_detection_t *)0x0) {
        iVar20 = za_00->id;
        if ((long)iVar20 != 0) {
          __size = za_00->family;
          __base = *(char **)&za_00->decision_margin;
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a904;
          qsort(__base,(long)iVar20,(size_t)__size,detection_compare_function);
        }
        ptVar13 = local_38->tp;
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a918;
        timeprofile_stamp(ptVar13,"cleanup");
        return (zarray_t *)za_00;
      }
      *(code **)((long)pzVar27 + -8) = timeprofile_stamp;
      __assert_fail("za != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                    ,0x1ac,"void zarray_sort(zarray_t *, int (*)(const void *, const void *))");
    }
    local_80 = CONCAT44(local_80._4_4_,iVar20);
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a168;
    zarray_get((zarray_t *)za_00,iVar20,local_48);
    iVar20 = 0;
    *(undefined8 *)((long)pzVar27 + -8) = 0x30;
    for (lVar29 = *(long *)((long)pzVar27 + -8); lVar29 != 0x70; lVar29 = lVar29 + 0x10) {
      lVar34 = CONCAT44(local_48[1],local_48[0]);
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a185;
      zarray_set(pzVar31,iVar20,(void *)(lVar34 + lVar29),outp);
      iVar20 = iVar20 + 1;
    }
    iVar20 = (int)local_80;
LAB_0010a193:
    iVar23 = iVar20;
    iVar20 = iVar23 + 1;
    *(undefined8 *)((long)pzVar27 + -8) = 0x10a19f;
    iVar21 = zarray_size((zarray_t *)za_00);
    if (iVar20 < iVar21) {
      *(undefined8 *)((long)pzVar27 + -8) = 0x10a1b5;
      zarray_get((zarray_t *)za_00,iVar20,&local_60);
      outp = local_60;
      if (((int)((size_t *)CONCAT44(local_48[1],local_48[0]))[1] == local_60->id) &&
         (*(apriltag_family_t **)CONCAT44(local_48[1],local_48[0]) == local_60->family)) {
        iVar21 = 0;
        *(undefined8 *)((long)pzVar27 + -8) = 0x30;
        for (lVar29 = *(long *)((long)pzVar27 + -8); pzVar31 = local_78, lVar29 != 0x70;
            lVar29 = lVar29 + 0x10) {
          pdVar19 = local_60->c;
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a1f1;
          zarray_set(za,iVar21,(void *)((long)pdVar19 + lVar29 + -0x20),outp);
          iVar21 = iVar21 + 1;
        }
        *(undefined8 *)((long)pzVar27 + -8) = 0x10a209;
        iVar21 = g2d_polygon_overlaps_polygon(pzVar31,za);
        det = local_60;
        za_00 = local_70;
        if (iVar21 != 0) {
          det_00 = (apriltag_detection_t *)CONCAT44(local_48[1],local_48[0]);
          iVar21 = det_00->hamming;
          iVar12 = local_60->hamming;
          outp = (apriltag_detection_t *)(ulong)(iVar12 < iVar21);
          *(undefined8 *)((long)pzVar27 + -8) = 0xffffffffffffffff;
          za_00 = local_70;
          uVar30 = *(ulong *)((long)pzVar27 + -8);
          if (iVar21 < iVar12) {
            outp = (apriltag_detection_t *)(uVar30 & 0xffffffff);
          }
          if ((int)outp == 0) {
            outp = (apriltag_detection_t *)(uVar30 & 0xffffffff);
            if (det_00->decision_margin <= det->decision_margin) {
              outp = (apriltag_detection_t *)(ulong)(det_00->decision_margin < det->decision_margin)
              ;
            }
          }
          *(undefined8 *)((long)pzVar27 + -8) = 0x38;
          for (lVar29 = *(long *)((long)pzVar27 + -8); iVar21 = (int)outp, lVar29 != 0x78;
              lVar29 = lVar29 + 0x10) {
            if (iVar21 == 0) {
              dVar37 = *(double *)((long)det_00->c + lVar29 + -0x28);
              dVar5 = *(double *)((long)det->c + lVar29 + -0x28);
              outp = (apriltag_detection_t *)(uVar30 & 0xffffffff);
              if (dVar5 <= dVar37) {
                outp = (apriltag_detection_t *)(ulong)(dVar5 < dVar37);
              }
            }
            if ((int)outp == 0) {
              dVar37 = *(double *)((long)det_00->c + lVar29 + -0x20);
              dVar5 = *(double *)((long)det->c + lVar29 + -0x20);
              outp = (apriltag_detection_t *)(uVar30 & 0xffffffff);
              if (dVar5 <= dVar37) {
                outp = (apriltag_detection_t *)(ulong)(dVar5 < dVar37);
              }
            }
          }
          if (iVar21 == 0) {
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a2e2;
            puts("uh oh, no preference for overlappingdetection");
            det_00 = (apriltag_detection_t *)CONCAT44(local_48[1],local_48[0]);
          }
          else if (iVar21 < 0) {
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a2ae;
            apriltag_detection_destroy(det);
            *(undefined8 *)((long)pzVar27 + -8) = 1;
            uVar15 = *(undefined8 *)((long)pzVar27 + -8);
            *(undefined8 *)((long)pzVar27 + -8) = 0x10a2bb;
            zarray_remove_index((zarray_t *)za_00,iVar20,(int)uVar15);
            iVar20 = iVar23;
            goto LAB_0010a193;
          }
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a2eb;
          apriltag_detection_destroy(det_00);
          iVar20 = (int)local_80;
          *(undefined8 *)((long)pzVar27 + -8) = 1;
          uVar15 = *(undefined8 *)((long)pzVar27 + -8);
          *(undefined8 *)((long)pzVar27 + -8) = 0x10a2fb;
          zarray_remove_index((zarray_t *)za_00,iVar20,(int)uVar15);
          goto LAB_0010a147;
        }
      }
      goto LAB_0010a193;
    }
    iVar20 = (int)local_80 + 1;
  } while( true );
}

Assistant:

zarray_t *apriltag_detector_detect(apriltag_detector_t *td, image_u8_t *im_orig)
{
    if (zarray_size(td->tag_families) == 0) {
        zarray_t *s = zarray_create(sizeof(apriltag_detection_t*));
        printf("apriltag.c: No tag families enabled.");
        return s;
    }

    if (td->wp == NULL || td->nthreads != workerpool_get_nthreads(td->wp)) {
        workerpool_destroy(td->wp);
        td->wp = workerpool_create(td->nthreads);
    }

    timeprofile_clear(td->tp);
    timeprofile_stamp(td->tp, "init");

    ///////////////////////////////////////////////////////////
    // Step 1. Detect quads according to requested image decimation
    // and blurring parameters.
    image_u8_t *quad_im = im_orig;
    if (td->quad_decimate > 1) {
        quad_im = image_u8_decimate(im_orig, td->quad_decimate);

        timeprofile_stamp(td->tp, "decimate");
    }

    if (td->quad_sigma != 0) {
        // compute a reasonable kernel width by figuring that the
        // kernel should go out 2 std devs.
        //
        // max sigma          ksz
        // 0.499              1  (disabled)
        // 0.999              3
        // 1.499              5
        // 1.999              7

        float sigma = fabsf((float) td->quad_sigma);

        int ksz = 4 * sigma; // 2 std devs in each direction
        if ((ksz & 1) == 0)
            ksz++;

        if (ksz > 1) {

            if (td->quad_sigma > 0) {
                // Apply a blur
                image_u8_gaussian_blur(quad_im, sigma, ksz);
            } else {
                // SHARPEN the image by subtracting the low frequency components.
                image_u8_t *orig = image_u8_copy(quad_im);
                image_u8_gaussian_blur(quad_im, sigma, ksz);

                for (int y = 0; y < orig->height; y++) {
                    for (int x = 0; x < orig->width; x++) {
                        int vorig = orig->buf[y*orig->stride + x];
                        int vblur = quad_im->buf[y*quad_im->stride + x];

                        int v = 2*vorig - vblur;
                        if (v < 0)
                            v = 0;
                        if (v > 255)
                            v = 255;

                        quad_im->buf[y*quad_im->stride + x] = (uint8_t) v;
                    }
                }
                image_u8_destroy(orig);
            }
        }
    }

    timeprofile_stamp(td->tp, "blur/sharp");

    if (td->debug)
        image_u8_write_pnm(quad_im, "debug_preprocess.pnm");

    zarray_t *quads = apriltag_quad_thresh(td, quad_im);
    
    // adjust centers of pixels so that they correspond to the
    // original full-resolution image.
    if (td->quad_decimate > 1) {
        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            for (int i = 0; i < 4; i++) {
                if (td->quad_decimate == 1.5) {
                    q->p[i][0] *= td->quad_decimate;
                    q->p[i][1] *= td->quad_decimate;
                } else {
                    q->p[i][0] = (q->p[i][0] - 0.5)*td->quad_decimate + 0.5;
                    q->p[i][1] = (q->p[i][1] - 0.5)*td->quad_decimate + 0.5;
                }
            }
        }
    }

    if (quad_im != im_orig)
        image_u8_destroy(quad_im);

    zarray_t *detections = zarray_create(sizeof(apriltag_detection_t*));

    td->nquads = zarray_size(quads);

    timeprofile_stamp(td->tp, "quads");

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);
        }

        image_u8_write_pnm(im_quads, "debug_quads_raw.pnm");
        image_u8_destroy(im_quads);
    }

    ////////////////////////////////////////////////////////////////
    // Step 2. Decode tags from each quad.
    if (1) {
        image_u8_t *im_samples = td->debug ? image_u8_copy(im_orig) : NULL;

        int chunksize = 1 + zarray_size(quads) / (APRILTAG_TASKS_PER_THREAD_TARGET * td->nthreads);

        struct quad_decode_task tasks[zarray_size(quads) / chunksize + 1];

        int ntasks = 0;
        for (int i = 0; i < zarray_size(quads); i+= chunksize) {
            tasks[ntasks].i0 = i;
            tasks[ntasks].i1 = imin(zarray_size(quads), i + chunksize);
            tasks[ntasks].quads = quads;
            tasks[ntasks].td = td;
            tasks[ntasks].im = im_orig;
            tasks[ntasks].detections = detections;

            tasks[ntasks].im_samples = im_samples;

            workerpool_add_task(td->wp, quad_decode_task, &tasks[ntasks]);
            ntasks++;
        }

        workerpool_run(td->wp);

        if (im_samples != NULL) {
            image_u8_write_pnm(im_samples, "debug_samples.pnm");
            image_u8_destroy(im_samples);
        }
    }

    if (td->debug) {
        image_u8_t *im_quads = image_u8_copy(im_orig);
        image_u8_darken(im_quads);
        image_u8_darken(im_quads);

        srandom(0);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *quad;
            zarray_get_volatile(quads, i, &quad);

            const int bias = 100;
            int color = bias + (random() % (255-bias));

            image_u8_draw_line(im_quads, quad->p[0][0], quad->p[0][1], quad->p[1][0], quad->p[1][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[1][0], quad->p[1][1], quad->p[2][0], quad->p[2][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[2][0], quad->p[2][1], quad->p[3][0], quad->p[3][1], color, 1);
            image_u8_draw_line(im_quads, quad->p[3][0], quad->p[3][1], quad->p[0][0], quad->p[0][1], color, 1);

        }

        image_u8_write_pnm(im_quads, "debug_quads_fixed.pnm");
        image_u8_destroy(im_quads);
    }

    timeprofile_stamp(td->tp, "decode+refinement");

    ////////////////////////////////////////////////////////////////
    // Step 3. Reconcile detections--- don't report the same tag more
    // than once. (Allow non-overlapping duplicate detections.)
    if (1) {
        zarray_t *poly0 = g2d_polygon_create_zeros(4);
        zarray_t *poly1 = g2d_polygon_create_zeros(4);

        for (int i0 = 0; i0 < zarray_size(detections); i0++) {

            apriltag_detection_t *det0;
            zarray_get(detections, i0, &det0);

            for (int k = 0; k < 4; k++)
                zarray_set(poly0, k, det0->p[k], NULL);

            for (int i1 = i0+1; i1 < zarray_size(detections); i1++) {

                apriltag_detection_t *det1;
                zarray_get(detections, i1, &det1);

                if (det0->id != det1->id || det0->family != det1->family)
                    continue;

                for (int k = 0; k < 4; k++)
                    zarray_set(poly1, k, det1->p[k], NULL);

                if (g2d_polygon_overlaps_polygon(poly0, poly1)) {
                    // the tags overlap. Delete one, keep the other.

                    int pref = 0; // 0 means undecided which one we'll keep.
                    pref = prefer_smaller(pref, det0->hamming, det1->hamming);     // want small hamming
                    pref = prefer_smaller(pref, -det0->decision_margin, -det1->decision_margin);      // want bigger margins

                    // if we STILL don't prefer one detection over the other, then pick
                    // any deterministic criterion.
                    for (int i = 0; i < 4; i++) {
                        pref = prefer_smaller(pref, det0->p[i][0], det1->p[i][0]);
                        pref = prefer_smaller(pref, det0->p[i][1], det1->p[i][1]);
                    }

                    if (pref == 0) {
                        // at this point, we should only be undecided if the tag detections
                        // are *exactly* the same. How would that happen?
                        printf("uh oh, no preference for overlappingdetection\n");
                    }

                    if (pref < 0) {
                        // keep det0, destroy det1
                        apriltag_detection_destroy(det1);
                        zarray_remove_index(detections, i1, 1);
                        i1--; // retry the same index
                        goto retry1;
                    } else {
                        // keep det1, destroy det0
                        apriltag_detection_destroy(det0);
                        zarray_remove_index(detections, i0, 1);
                        i0--; // retry the same index.
                        goto retry0;
                    }
                }

              retry1: ;
            }

          retry0: ;
        }

        zarray_destroy(poly0);
        zarray_destroy(poly1);
    }

    timeprofile_stamp(td->tp, "reconcile");

    ////////////////////////////////////////////////////////////////
    // Produce final debug output
    if (td->debug) {

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        FILE *f = fopen("debug_output.ps", "w");
        fprintf(f, "%%!PS\n\n");
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");
        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    det->p[0][0], det->p[0][1],
                    det->p[1][0], det->p[1][1],
                    det->p[2][0], det->p[2][1],
                    det->p[3][0], det->p[3][1],
                    det->p[0][0], det->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    if (td->debug) {
        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        image_u8x3_t *out = image_u8x3_create(darker->width, darker->height);
        for (int y = 0; y < im_orig->height; y++) {
            for (int x = 0; x < im_orig->width; x++) {
                out->buf[y*out->stride + 3*x + 0] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 1] = darker->buf[y*darker->stride + x];
                out->buf[y*out->stride + 3*x + 2] = darker->buf[y*darker->stride + x];
            }
        }

        for (int i = 0; i < zarray_size(detections); i++) {
            apriltag_detection_t *det;
            zarray_get(detections, i, &det);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            for (int j = 0; j < 4; j++) {
                int k = (j + 1) & 3;
                image_u8x3_draw_line(out,
                                     det->p[j][0], det->p[j][1], det->p[k][0], det->p[k][1],
                                     (uint8_t[]) { rgb[0], rgb[1], rgb[2] },
                                     1);
            }
        }

        image_u8x3_write_pnm(out, "debug_output.pnm");
        image_u8x3_destroy(out);
    }

    // deallocate
    if (td->debug) {
        FILE *f = fopen("debug_quads.ps", "w");
        fprintf(f, "%%!PS\n\n");

        image_u8_t *darker = image_u8_copy(im_orig);
        image_u8_darken(darker);
        image_u8_darken(darker);

        // assume letter, which is 612x792 points.
        double scale = fmin(612.0/darker->width, 792.0/darker->height);
        fprintf(f, "%f %f scale\n", scale, scale);
        fprintf(f, "0 %d translate\n", darker->height);
        fprintf(f, "1 -1 scale\n");

        postscript_image(f, darker);

        image_u8_destroy(darker);

        for (int i = 0; i < zarray_size(quads); i++) {
            struct quad *q;
            zarray_get_volatile(quads, i, &q);

            float rgb[3];
            int bias = 100;

            for (int i = 0; i < 3; i++)
                rgb[i] = bias + (random() % (255-bias));

            fprintf(f, "%f %f %f setrgbcolor\n", rgb[0]/255.0f, rgb[1]/255.0f, rgb[2]/255.0f);
            fprintf(f, "%f %f moveto %f %f lineto %f %f lineto %f %f lineto %f %f lineto stroke\n",
                    q->p[0][0], q->p[0][1],
                    q->p[1][0], q->p[1][1],
                    q->p[2][0], q->p[2][1],
                    q->p[3][0], q->p[3][1],
                    q->p[0][0], q->p[0][1]);
        }

        fprintf(f, "showpage\n");
        fclose(f);
    }

    timeprofile_stamp(td->tp, "debug output");

    for (int i = 0; i < zarray_size(quads); i++) {
        struct quad *quad;
        zarray_get_volatile(quads, i, &quad);
        matd_destroy(quad->H);
        matd_destroy(quad->Hinv);
    }

    zarray_destroy(quads);

    zarray_sort(detections, detection_compare_function);
    timeprofile_stamp(td->tp, "cleanup");

    return detections;
}